

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

_AL_LIST * list_do_create(size_t capacity,size_t extra_item_size)

{
  _AL_LIST *p_Var1;
  _Bool _Var2;
  _AL_LIST_ITEM *item;
  _AL_LIST *p_Var3;
  _AL_LIST *p_Var4;
  _AL_LIST *p_Var5;
  long lVar6;
  
  p_Var3 = (_AL_LIST *)
           al_malloc_with_context
                     (capacity * 0x28 + 0x68,0x6e,
                      "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/misc/list.c"
                      ,"list_do_create");
  if (p_Var3 == (_AL_LIST *)0x0) {
    _Var2 = _al_trace_prefix("list",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/misc/list.c"
                             ,0x70,"list_do_create");
    if (_Var2) {
      p_Var3 = (_AL_LIST *)0x0;
      _al_trace_suffix("Out of memory.");
    }
    else {
      p_Var3 = (_AL_LIST *)0x0;
    }
  }
  else {
    p_Var4 = p_Var3 + 1;
    p_Var3->size = 0;
    p_Var3->capacity = capacity;
    p_Var3->item_size = 0x28;
    p_Var3->item_size_with_extra = 0x28;
    lVar6 = capacity + 1 + (ulong)(capacity == 0xffffffffffffffff);
    p_Var3->next_free = (_AL_LIST_ITEM *)p_Var4;
    p_Var3->user_data = (void *)0x0;
    p_Var3->dtor = (_AL_LIST_DTOR)0x0;
    p_Var1 = p_Var4;
    do {
      p_Var5 = p_Var1;
      p_Var5->root = (_AL_LIST_ITEM *)p_Var3;
      p_Var5->size = (size_t)&p_Var5->next_free;
      lVar6 = lVar6 + -1;
      p_Var1 = (_AL_LIST *)&p_Var5->next_free;
    } while (lVar6 != 0);
    p_Var5->size = 0;
    p_Var3->next_free = (_AL_LIST_ITEM *)p_Var3[1].size;
    p_Var3->root = (_AL_LIST_ITEM *)p_Var4;
    p_Var3[1].item_size_with_extra = 0;
    p_Var3[1].size = (size_t)p_Var4;
    p_Var3[1].capacity = (size_t)p_Var4;
  }
  return p_Var3;
}

Assistant:

static _AL_LIST* list_do_create(size_t capacity, size_t extra_item_size)
{
   size_t i;
   size_t memory_size;
   uint8_t* memory_ptr;
   _AL_LIST* list = NULL;
   _AL_LIST_ITEM* item = NULL;
   _AL_LIST_ITEM* prev = NULL;


   /* Calculate amount of memory needed for the list.
    * Always at least one element is allocated together with list,
    * which is intended to be a root.
    */
   memory_size = sizeof(_AL_LIST) + (capacity + 1) * (sizeof(_AL_LIST_ITEM) + extra_item_size);

   memory_ptr = (uint8_t*)al_malloc(memory_size);
   if (NULL == memory_ptr) {
      ALLEGRO_ERROR("Out of memory.");
      return NULL;
   }

   list                       = (_AL_LIST*)memory_ptr;
   memory_ptr                += sizeof(_AL_LIST);
   list->size                 = 0;
   list->capacity             = capacity;
   list->item_size            = sizeof(_AL_LIST_ITEM);
   list->item_size_with_extra = sizeof(_AL_LIST_ITEM) + extra_item_size;
   list->next_free            = (_AL_LIST_ITEM*)memory_ptr;
   list->user_data            = NULL;
   list->dtor                 = NULL;

   /* Initialize free item list.
    */
   prev = NULL;
   item = list->next_free;
   for (i = 0; i <= list->capacity; ++i) {

      memory_ptr += list->item_size_with_extra;
      item->list  = list;
      item->next  = (_AL_LIST_ITEM*)memory_ptr;
      prev        = item;
      item        = item->next;
   }

   /* Set proper free list tail value. */
   prev->next = NULL;

   /* Initialize root. */
   list->root = list_get_free_item(list);
   list->root->dtor = NULL;
   list->root->next = list->root;
   list->root->prev = list->root;

   return list;
}